

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> * __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::operator=
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,
          Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_2)

{
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *in_RSI;
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *in_RDI;
  
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::operator=
            (in_RDI,in_RSI);
  return (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)in_RDI;
}

Assistant:

class GTEST_API_ Matcher<const internal::StringView&>
    : public internal::MatcherBase<const internal::StringView&> {
 public:
  Matcher() = default;

  explicit Matcher(const MatcherInterface<const internal::StringView&>* impl)
      : internal::MatcherBase<const internal::StringView&>(impl) {}

  template <typename M, typename = typename std::remove_reference<
                            M>::type::is_gtest_matcher>
  Matcher(M&& m)  // NOLINT
      : internal::MatcherBase<const internal::StringView&>(std::forward<M>(m)) {
  }

  // Allows the user to write str instead of Eq(str) sometimes, where
  // str is a std::string object.
  Matcher(const std::string& s);  // NOLINT

  // Allows the user to write "foo" instead of Eq("foo") sometimes.
  Matcher(const char* s);  // NOLINT

  // Allows the user to pass absl::string_views or std::string_views directly.
  Matcher(internal::StringView s);  // NOLINT
}